

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

void Lib::List<Inferences::ALASCA::FourierMotzkinConf::Lhs>::push
               (Lhs *elem,List<Inferences::ALASCA::FourierMotzkinConf::Lhs> **lst)

{
  List<Inferences::ALASCA::FourierMotzkinConf::Lhs> *pLVar1;
  SelectedSummand SStack_78;
  SelectedSummand local_48;
  
  Kernel::SelectedSummand::SelectedSummand(&SStack_78,&elem->super_SelectedSummand);
  Kernel::SelectedSummand::SelectedSummand(&local_48,&SStack_78);
  pLVar1 = cons((Lhs *)&local_48,*lst);
  *lst = pLVar1;
  return;
}

Assistant:

static void push(C elem,List* &lst)
  {
    lst = cons(elem, lst);
  }